

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_state_machine.cpp
# Opt level: O3

void __thiscall
duckdb::CSVStateMachine::CSVStateMachine
          (CSVStateMachine *this,CSVReaderOptions *options_p,
          CSVStateMachineOptions *state_machine_options_p,
          CSVStateMachineCache *csv_state_machine_cache)

{
  pointer pcVar1;
  CSVOption<char> CVar2;
  CSVOption<char> CVar3;
  CSVOption<duckdb::NewLineIdentifier> CVar4;
  StateMachine *pSVar5;
  
  pSVar5 = CSVStateMachineCache::Get(csv_state_machine_cache,state_machine_options_p);
  this->transition_array = pSVar5;
  (this->state_machine_options).delimiter.set_by_user =
       (state_machine_options_p->delimiter).set_by_user;
  (this->state_machine_options).delimiter.value._M_dataplus._M_p =
       (pointer)&(this->state_machine_options).delimiter.value.field_2;
  pcVar1 = (state_machine_options_p->delimiter).value._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->state_machine_options).delimiter.value,pcVar1,
             pcVar1 + (state_machine_options_p->delimiter).value._M_string_length);
  (this->state_machine_options).strict_mode = state_machine_options_p->strict_mode;
  CVar2 = state_machine_options_p->escape;
  CVar3 = state_machine_options_p->comment;
  CVar4 = state_machine_options_p->new_line;
  (this->state_machine_options).quote = state_machine_options_p->quote;
  (this->state_machine_options).escape = CVar2;
  (this->state_machine_options).comment = CVar3;
  (this->state_machine_options).new_line = CVar4;
  this->options = options_p;
  DialectOptions::DialectOptions(&this->dialect_options);
  (this->dialect_options).state_machine_options.delimiter.set_by_user =
       (this->state_machine_options).delimiter.set_by_user;
  ::std::__cxx11::string::_M_assign
            ((string *)&(this->dialect_options).state_machine_options.delimiter.value);
  (this->dialect_options).state_machine_options.strict_mode =
       (this->state_machine_options).strict_mode;
  CVar2 = (this->state_machine_options).escape;
  CVar3 = (this->state_machine_options).comment;
  CVar4 = (this->state_machine_options).new_line;
  (this->dialect_options).state_machine_options.quote = (this->state_machine_options).quote;
  (this->dialect_options).state_machine_options.escape = CVar2;
  (this->dialect_options).state_machine_options.comment = CVar3;
  (this->dialect_options).state_machine_options.new_line = CVar4;
  return;
}

Assistant:

CSVStateMachine::CSVStateMachine(CSVReaderOptions &options_p, const CSVStateMachineOptions &state_machine_options_p,
                                 CSVStateMachineCache &csv_state_machine_cache)
    : transition_array(csv_state_machine_cache.Get(state_machine_options_p)),
      state_machine_options(state_machine_options_p), options(options_p) {
	dialect_options.state_machine_options = state_machine_options;
}